

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1229e27::TryParseInteger(cmExecutionStatus *status,string *str,int *i)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  ostringstream e;
  char *local_1a8 [47];
  
  __nptr = (str->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,local_1a8,10);
  if (local_1a8[0] == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    *i = (int)lVar3;
    return true;
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

bool TryParseInteger(cmExecutionStatus& status, const std::string& str, int& i)
{
  try {
    i = std::stoi(str);
  } catch (std::invalid_argument&) {
    std::ostringstream e;
    e << "Invalid integer: '" << str << "'";
    status.SetError(e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  } catch (std::out_of_range&) {
    std::ostringstream e;
    e << "Integer out of range: '" << str << "'";
    status.SetError(e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}